

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void pcut_print_tests(pcut_item_t *first)

{
  int iVar1;
  pcut_item_t *local_18;
  pcut_item_t *it;
  pcut_item_t *first_local;
  
  local_18 = pcut_get_real(first);
  do {
    if (local_18 == (pcut_item_t *)0x0) {
      return;
    }
    iVar1 = local_18->kind;
    if (1 < iVar1 - 2U) {
      if (iVar1 == 4) {
        printf("  Suite `%s\' [%d]\n",local_18->name,(ulong)(uint)local_18->id);
      }
      else {
        if (iVar1 != 5) {
          __assert_fail("0 && \"unreachable case in item-kind switch\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vhotspur[P]pcut/src/print.c"
                        ,0x5c,"void pcut_print_tests(pcut_item_t *)");
        }
        printf("    Test `%s\' [%d]\n",local_18->name,(ulong)(uint)local_18->id);
      }
    }
    local_18 = pcut_get_real_next(local_18);
  } while( true );
}

Assistant:

void pcut_print_tests(pcut_item_t *first) {
	pcut_item_t *it;
	for (it = pcut_get_real(first); it != NULL; it = pcut_get_real_next(it)) {
		switch (it->kind) {
		case PCUT_KIND_TESTSUITE:
			printf("  Suite `%s' [%d]\n", it->name, it->id);
			break;
		case PCUT_KIND_TEST:
			printf("    Test `%s' [%d]\n", it->name, it->id);
			break;
		case PCUT_KIND_SETUP:
		case PCUT_KIND_TEARDOWN:
			/* Fall-through, do nothing. */
			break;
		default:
			assert(0 && "unreachable case in item-kind switch");
			break;
		}
	}
}